

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferQueryNegativeTest::iterate
          (MutableRenderBufferQueryNegativeTest *this)

{
  deUint32 dVar1;
  deBool dVar2;
  int iVar3;
  int iVar4;
  EGLint err;
  EGLBoolean ret;
  EGLint curRenderBuffer;
  Library *egl;
  MutableRenderBufferQueryNegativeTest *this_local;
  
  egl = (Library *)this;
  _ret = EglTestContext::getLibrary
                   ((this->super_MutableRenderBufferTest).super_TestCase.m_eglTestCtx);
  err = -1;
  do {
    (*_ret->_vptr_Library[0x2b])
              (_ret,(this->super_MutableRenderBufferTest).m_eglDisplay,
               (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,&err);
    dVar1 = (*_ret->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                     ,0x15b);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (err == 0x3084) {
    iVar3 = (*_ret->_vptr_Library[0x30])
                      (_ret,(this->super_MutableRenderBufferTest).m_eglDisplay,
                       (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,0x3085);
    iVar4 = (*_ret->_vptr_Library[0x1f])();
    if (iVar3 == 0) {
      if (iVar4 == 0x3009) {
        do {
          (*_ret->_vptr_Library[0x2b])
                    (_ret,(this->super_MutableRenderBufferTest).m_eglDisplay,
                     (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,&err);
          dVar1 = (*_ret->_vptr_Library[0x1f])();
          eglu::checkError(dVar1,
                           "querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                           ,0x172);
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        if (err == 0x3084) {
          tcu::TestContext::setTestResult
                    ((this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                     "Surface didn\'t stay in back-buffered rendering after error");
        }
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "eglSurfaceAttrib didn\'t set the EGL_BAD_MATCH error when trying to enable single-buffering on a context without the mutable render buffer bit set"
                  );
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,
                 "eglSurfaceAttrib didn\'t return false when trying to enable single-buffering on a context without the mutable render buffer bit set"
                );
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Surface didn\'t default to back-buffered rendering");
  }
  return STOP;
}

Assistant:

TestCase::IterateResult MutableRenderBufferQueryNegativeTest::iterate (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	// check that by default the query returns back buffered
	EGLint curRenderBuffer = -1;
	EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer));
	if (curRenderBuffer != EGL_BACK_BUFFER)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Surface didn't default to back-buffered rendering");
		return STOP;
	}

	// check that trying to switch to single-buffer rendering fails when the config bit is not set
	EGLBoolean ret = egl.surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_SINGLE_BUFFER);
	EGLint err = egl.getError();
	if (ret != EGL_FALSE)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
			"eglSurfaceAttrib didn't return false when trying to enable single-buffering on a context without the mutable render buffer bit set");
		return STOP;
	}
	if (err != EGL_BAD_MATCH)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
			"eglSurfaceAttrib didn't set the EGL_BAD_MATCH error when trying to enable single-buffering on a context without the mutable render buffer bit set");
		return STOP;
	}

    EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer));
    if (curRenderBuffer != EGL_BACK_BUFFER)
    {
        m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Surface didn't stay in back-buffered rendering after error");
        return STOP;
    }

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}